

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvisualmatrix.cpp
# Opt level: O1

void VisualMatrix<std::complex<float>>(TPZFMatrix<std::complex<float>_> *matrix,string *outfilename)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = std::__cxx11::string::rfind((char *)outfilename,0x158df5e,0xffffffffffffffff);
  iVar3 = std::__cxx11::string::rfind((char *)outfilename,0x15572e5,0xffffffffffffffff);
  iVar1 = (int)outfilename->_M_string_length;
  if (iVar1 - iVar2 == 3) {
    VisualMatrixDX<std::complex<float>>(matrix,outfilename);
    return;
  }
  if (iVar1 - iVar3 == 4) {
    VisualMatrixVTK<std::complex<float>>(matrix,outfilename);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"visualmatrix output was not created\n",0x24);
  return;
}

Assistant:

void VisualMatrix(TPZFMatrix<TVar> & matrix, const std::string &outfilename)
{
	int posdx = outfilename.rfind(".dx");
	int posvtk = outfilename.rfind(".vtk");
	int filelength = outfilename.size();
	if(filelength-posdx == 3) {
		VisualMatrixDX(matrix,outfilename);
	} else if(filelength-posvtk == 4) {
		VisualMatrixVTK(matrix,outfilename);
	} else {
		cout << "visualmatrix output was not created\n";
	}
}